

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysinfo.cpp
# Opt level: O2

int embree::getCPUFeatures(void)

{
  uint *puVar1;
  uint *puVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  bool bVar11;
  
  if (getCPUFeatures::cpu_features != 0) {
    return getCPUFeatures::cpu_features;
  }
  uVar5 = 0;
  puVar1 = (uint *)cpuid_basic_info(0);
  puVar2 = (uint *)cpuid(0x80000000);
  bVar11 = true;
  if (*puVar1 == 0) {
    uVar9 = 0;
    uVar8 = 0;
  }
  else {
    lVar3 = cpuid_Version_info(1);
    uVar9 = *(uint *)(lVar3 + 8);
    uVar8 = *(uint *)(lVar3 + 0xc);
    if (6 < *puVar1) {
      lVar3 = cpuid_Extended_Feature_Enumeration_info(7);
      uVar5 = *(uint *)(lVar3 + 4);
      bVar10 = (*(uint *)(lVar3 + 0xc) & 2) == 0;
      goto LAB_001bae59;
    }
  }
  bVar10 = true;
LAB_001bae59:
  if (0x80000000 < *puVar2) {
    lVar3 = cpuid(0x80000001);
    bVar11 = (*(uint *)(lVar3 + 0xc) & 0x20) == 0;
  }
  if ((uVar8 >> 0x1b & 1) == 0) {
    getCPUFeatures::cpu_features = 0x2000000;
  }
  else {
    uVar4 = get_xcr0();
    if ((uVar4 & 2) != 0) {
      getCPUFeatures::cpu_features = getCPUFeatures::cpu_features | 0x2000000;
    }
    if (((uint)uVar4 & 6) == 6) {
      getCPUFeatures::cpu_features = getCPUFeatures::cpu_features | 0x4000000;
    }
    if (((uint)uVar4 & 0xe6) == 0xe6) {
      getCPUFeatures::cpu_features = getCPUFeatures::cpu_features | 0x8000000;
    }
  }
  uVar6 = (uVar8 & 0x1000) >> 1 |
          (uVar5 & 0x20) << 5 |
          (uVar8 & 0x70000000) >> 0x15 | (uVar8 & 0x800000) >> 0x11 | (uVar8 & 0x180000) >> 0xf |
          (uVar8 & 0x200) >> 6 | (uVar8 & 1) * 4 | uVar9 >> 0x19 & 3 | getCPUFeatures::cpu_features;
  uVar7 = uVar6 | 0x1000;
  if (bVar11) {
    uVar7 = uVar6;
  }
  uVar7 = (uVar5 & 0x200000) * 4 |
          (uVar5 & 0x40000000) >> 9 |
          (uVar5 & 0x1c000000) >> 8 | (uVar5 & 0x100) << 6 | (uVar5 & 8) << 10 | uVar5 & 0x10000 |
          uVar5 & 0x20000 | uVar7;
  uVar6 = uVar7 | 0x400000;
  if (-1 < (int)uVar5) {
    uVar6 = uVar7;
  }
  uVar7 = uVar6 | 0x1000000;
  if (bVar10) {
    uVar7 = uVar6;
  }
  if ((bool)(-1 < (int)uVar5 & bVar11 &
             ((uVar5 & 0x200000) == 0 &&
             (((uVar5 & 0x40000000) == 0 &&
              ((uVar5 & 0x1c000000) == 0 &&
              ((((uVar5 & 0x100) == 0 && ((uVar5 & 8) == 0 && (uVar8 & 0x1000) == 0)) &&
               (uVar5 & 0x10000) == 0) && (uVar5 & 0x20000) == 0))) &&
             (((uVar8 & 0x70000000) == 0 &&
              (((uVar8 & 0x180000) == 0 &&
               (((uVar8 & 1) == 0 && (uVar9 & 0x6000000) == 0) && (uVar8 & 0x200) == 0)) &&
              (uVar8 & 0x800000) == 0)) && (uVar5 & 0x20) == 0))) & bVar10)) {
    return uVar7;
  }
  getCPUFeatures::cpu_features = uVar7;
  return uVar7;
}

Assistant:

int getCPUFeatures()
  {
#if defined(__X86_ASM__)
    /* cache CPU features access */
    static int cpu_features = 0;
    if (cpu_features) 
      return cpu_features;

    /* get number of CPUID leaves */
    int cpuid_leaf0[4]; 
    __cpuid(cpuid_leaf0, 0x00000000);
    unsigned nIds = cpuid_leaf0[EAX];  

    /* get number of extended CPUID leaves */
    int cpuid_leafe[4]; 
    __cpuid(cpuid_leafe, 0x80000000);
    unsigned nExIds = cpuid_leafe[EAX];

    /* get CPUID leaves for EAX = 1,7, and 0x80000001 */
    int cpuid_leaf_1[4] = { 0,0,0,0 };
    int cpuid_leaf_7[4] = { 0,0,0,0 };
    int cpuid_leaf_e1[4] = { 0,0,0,0 };
    if (nIds >= 1) __cpuid (cpuid_leaf_1,0x00000001);
#if _WIN32
#if _MSC_VER && (_MSC_FULL_VER < 160040219)
#else
    if (nIds >= 7) __cpuidex(cpuid_leaf_7,0x00000007,0);
#endif
#else
    if (nIds >= 7) __cpuid_count(cpuid_leaf_7,0x00000007,0);
#endif
    if (nExIds >= 0x80000001) __cpuid(cpuid_leaf_e1,0x80000001);

    /* detect if OS saves XMM, YMM, and ZMM states */
    bool xmm_enabled = true;
    bool ymm_enabled = false;
    bool zmm_enabled = false;
    if (cpuid_leaf_1[ECX] & CPU_FEATURE_BIT_OXSAVE) {
      int64_t xcr0 = get_xcr0();
      xmm_enabled = ((xcr0 & 0x02) == 0x02);                /* checks if xmm are enabled in XCR0 */
      ymm_enabled = xmm_enabled && ((xcr0 & 0x04) == 0x04); /* checks if ymm state are enabled in XCR0 */
      zmm_enabled = ymm_enabled && ((xcr0 & 0xE0) == 0xE0); /* checks if OPMASK state, upper 256-bit of ZMM0-ZMM15 and ZMM16-ZMM31 state are enabled in XCR0 */
    }
    if (xmm_enabled) cpu_features |= CPU_FEATURE_XMM_ENABLED;
    if (ymm_enabled) cpu_features |= CPU_FEATURE_YMM_ENABLED;
    if (zmm_enabled) cpu_features |= CPU_FEATURE_ZMM_ENABLED;
    
    if (cpuid_leaf_1[EDX] & CPU_FEATURE_BIT_SSE   ) cpu_features |= CPU_FEATURE_SSE;
    if (cpuid_leaf_1[EDX] & CPU_FEATURE_BIT_SSE2  ) cpu_features |= CPU_FEATURE_SSE2;
    if (cpuid_leaf_1[ECX] & CPU_FEATURE_BIT_SSE3  ) cpu_features |= CPU_FEATURE_SSE3;
    if (cpuid_leaf_1[ECX] & CPU_FEATURE_BIT_SSSE3 ) cpu_features |= CPU_FEATURE_SSSE3;
    if (cpuid_leaf_1[ECX] & CPU_FEATURE_BIT_SSE4_1) cpu_features |= CPU_FEATURE_SSE41;
    if (cpuid_leaf_1[ECX] & CPU_FEATURE_BIT_SSE4_2) cpu_features |= CPU_FEATURE_SSE42;
    if (cpuid_leaf_1[ECX] & CPU_FEATURE_BIT_POPCNT) cpu_features |= CPU_FEATURE_POPCNT;
    
    if (cpuid_leaf_1[ECX] & CPU_FEATURE_BIT_AVX   ) cpu_features |= CPU_FEATURE_AVX;
    if (cpuid_leaf_1[ECX] & CPU_FEATURE_BIT_F16C  ) cpu_features |= CPU_FEATURE_F16C;
    if (cpuid_leaf_1[ECX] & CPU_FEATURE_BIT_RDRAND) cpu_features |= CPU_FEATURE_RDRAND;
    if (cpuid_leaf_7[EBX] & CPU_FEATURE_BIT_AVX2  ) cpu_features |= CPU_FEATURE_AVX2;
    if (cpuid_leaf_1[ECX] & CPU_FEATURE_BIT_FMA3  ) cpu_features |= CPU_FEATURE_FMA3;
    if (cpuid_leaf_e1[ECX] & CPU_FEATURE_BIT_LZCNT) cpu_features |= CPU_FEATURE_LZCNT;
    if (cpuid_leaf_7 [EBX] & CPU_FEATURE_BIT_BMI1 ) cpu_features |= CPU_FEATURE_BMI1;
    if (cpuid_leaf_7 [EBX] & CPU_FEATURE_BIT_BMI2 ) cpu_features |= CPU_FEATURE_BMI2;

    if (cpuid_leaf_7[EBX] & CPU_FEATURE_BIT_AVX512F   ) cpu_features |= CPU_FEATURE_AVX512F;
    if (cpuid_leaf_7[EBX] & CPU_FEATURE_BIT_AVX512DQ  ) cpu_features |= CPU_FEATURE_AVX512DQ;
    if (cpuid_leaf_7[EBX] & CPU_FEATURE_BIT_AVX512PF  ) cpu_features |= CPU_FEATURE_AVX512PF;
    if (cpuid_leaf_7[EBX] & CPU_FEATURE_BIT_AVX512ER  ) cpu_features |= CPU_FEATURE_AVX512ER; 
    if (cpuid_leaf_7[EBX] & CPU_FEATURE_BIT_AVX512CD  ) cpu_features |= CPU_FEATURE_AVX512CD;
    if (cpuid_leaf_7[EBX] & CPU_FEATURE_BIT_AVX512BW  ) cpu_features |= CPU_FEATURE_AVX512BW;
    if (cpuid_leaf_7[EBX] & CPU_FEATURE_BIT_AVX512IFMA) cpu_features |= CPU_FEATURE_AVX512IFMA;
    if (cpuid_leaf_7[EBX] & CPU_FEATURE_BIT_AVX512VL  ) cpu_features |= CPU_FEATURE_AVX512VL;
    if (cpuid_leaf_7[ECX] & CPU_FEATURE_BIT_AVX512VBMI) cpu_features |= CPU_FEATURE_AVX512VBMI;

#if defined(__MACOSX__)
    if (   (cpu_features & CPU_FEATURE_AVX512F)
        || (cpu_features & CPU_FEATURE_AVX512DQ)
        || (cpu_features & CPU_FEATURE_AVX512CD)
        || (cpu_features & CPU_FEATURE_AVX512BW)
        || (cpu_features & CPU_FEATURE_AVX512VL) )
      {
        // on macOS AVX512 will be enabled automatically by the kernel when the first AVX512 instruction is called
        // see https://github.com/apple/darwin-xnu/blob/0a798f6738bc1db01281fc08ae024145e84df927/osfmk/i386/fpu.c#L176
        // therefore we ignore the state of XCR0
        cpu_features |= CPU_FEATURE_ZMM_ENABLED;
      }
#endif
    return cpu_features;

#elif defined(__ARM_NEON) || defined(__EMSCRIPTEN__)

    int cpu_features = CPU_FEATURE_NEON|CPU_FEATURE_SSE|CPU_FEATURE_SSE2;
    cpu_features |= CPU_FEATURE_SSE3|CPU_FEATURE_SSSE3|CPU_FEATURE_SSE42;
    cpu_features |= CPU_FEATURE_XMM_ENABLED;
    cpu_features |= CPU_FEATURE_YMM_ENABLED;
    cpu_features |= CPU_FEATURE_SSE41 | CPU_FEATURE_RDRAND | CPU_FEATURE_F16C;
    cpu_features |= CPU_FEATURE_POPCNT;
    cpu_features |= CPU_FEATURE_AVX;
    cpu_features |= CPU_FEATURE_AVX2;
    cpu_features |= CPU_FEATURE_FMA3;
    cpu_features |= CPU_FEATURE_LZCNT;
    cpu_features |= CPU_FEATURE_BMI1;
    cpu_features |= CPU_FEATURE_BMI2;
    cpu_features |= CPU_FEATURE_NEON_2X;
    return cpu_features;

#else
    /* Unknown CPU. */
    return 0;
#endif
  }